

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_listener_accept(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  void *item;
  nni_ws *ws;
  nni_ws_listener *l;
  nni_aio *aio_local;
  void *arg_local;
  
  nni_aio_reset(aio);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x60));
  if ((*(byte *)((long)arg + 0x111) & 1) == 0) {
    if ((*(byte *)((long)arg + 0x110) & 1) == 0) {
      nni_aio_finish_error(aio,NNG_ESTATE);
      nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
    }
    else {
      item = nni_list_first((nni_list *)((long)arg + 0xc0));
      if (item == (void *)0x0) {
        _Var1 = nni_aio_start(aio,ws_accept_cancel,arg);
        if (_Var1) {
          nni_list_append((nni_list *)((long)arg + 0xf0),aio);
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        }
        else {
          nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        }
      }
      else {
        nni_list_remove((nni_list *)((long)arg + 0xc0),item);
        nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
        nni_aio_set_output(aio,0,item);
        nni_aio_finish(aio,NNG_OK,0);
      }
    }
  }
  else {
    nni_aio_finish_error(aio,NNG_ECLOSED);
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x60));
  }
  return;
}

Assistant:

static void
ws_listener_accept(void *arg, nni_aio *aio)
{
	nni_ws_listener *l = arg;
	nni_ws          *ws;

	nni_aio_reset(aio);
	nni_mtx_lock(&l->mtx);
	if (l->closed) {
		nni_aio_finish_error(aio, NNG_ECLOSED);
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if (!l->started) {
		nni_aio_finish_error(aio, NNG_ESTATE);
		nni_mtx_unlock(&l->mtx);
		return;
	}
	if ((ws = nni_list_first(&l->pend)) != NULL) {
		nni_list_remove(&l->pend, ws);
		nni_mtx_unlock(&l->mtx);
		nni_aio_set_output(aio, 0, ws);
		nni_aio_finish(aio, 0, 0);
		return;
	}
	if (!nni_aio_start(aio, ws_accept_cancel, l)) {
		nni_mtx_unlock(&l->mtx);
		return;
	}
	nni_list_append(&l->aios, aio);
	nni_mtx_unlock(&l->mtx);
}